

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O2

void regen_monster(monster *mon,wchar_t num)

{
  byte *pbVar1;
  _Bool _Var2;
  short sVar3;
  uint uVar4;
  
  sVar3 = mon->maxhp;
  if (mon->hp < sVar3) {
    uVar4 = 1;
    if (0xc6 < (ushort)(sVar3 + 99U)) {
      uVar4 = (uint)(ushort)(sVar3 / 100);
    }
    _Var2 = flag_has_dbg(mon->race->flags,0xc,0x18,"mon->race->flags","RF_REGENERATE");
    sVar3 = (short)(uVar4 << _Var2) * (short)num + mon->hp;
    if (mon->maxhp <= sVar3) {
      sVar3 = mon->maxhp;
    }
    mon->hp = sVar3;
    if (player->upkeep->health_who == mon) {
      pbVar1 = (byte *)((long)&player->upkeep->redraw + 1);
      *pbVar1 = *pbVar1 | 2;
    }
  }
  return;
}

Assistant:

static void regen_monster(struct monster *mon, int num)
{
	/* Regenerate (if needed) */
	if (mon->hp < mon->maxhp) {
		/* Base regeneration */
		int frac = mon->maxhp / 100;

		/* Minimal regeneration rate */
		if (!frac) frac = 1;

		/* Some monsters regenerate quickly */
		if (rf_has(mon->race->flags, RF_REGENERATE)) frac *= 2;

		/* Multiply by number of regenerations */
		frac *= num;

		/* Regenerate */
		mon->hp += frac;

		/* Do not over-regenerate */
		if (mon->hp > mon->maxhp) mon->hp = mon->maxhp;

		/* Redraw (later) if needed */
		if (player->upkeep->health_who == mon)
			player->upkeep->redraw |= (PR_HEALTH);
	}
}